

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

void __thiscall
branch_and_reduce_algorithm::compute_fold
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *S,
          vector<int,_std::allocator<int>_> *NS)

{
  fast_set *this_00;
  ArraySet *this_01;
  int iVar1;
  pointer pvVar2;
  int *piVar3;
  pointer piVar4;
  pointer piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  _func_int **pp_Var7;
  bool bVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int *piVar17;
  int iVar18;
  int *piVar19;
  vector<int,_std::allocator<int>_> *__range1_1;
  pointer piVar20;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> vs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  vector<int,_std::allocator<int>_> removed;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  pointer local_88;
  
  lVar14 = (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
  if ((long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2 != (lVar14 >> 2) + 1) {
    __assert_fail("NS.size() == S.size() + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0xca,
                  "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  std::vector<int,_std::allocator<int>_>::vector(&removed,lVar14 >> 1,(allocator_type *)local_98);
  piVar20 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  lVar14 = (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar20;
  uVar13 = lVar14 >> 2;
  for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < uVar13; uVar15 = uVar15 + 1) {
    removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar16] = piVar20[uVar16];
  }
  piVar20 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  for (uVar15 = 1; uVar15 - 1 < uVar13; uVar15 = uVar15 + 1) {
    *(int *)((long)removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + (ulong)(uVar15 - 1) * 4 + lVar14) =
         piVar20[uVar15];
  }
  iVar1 = *(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  this_00 = &this->used;
  fast_set::clear(this_00);
  piVar19 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar20 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (piVar9 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar9 != piVar19; piVar9 = piVar9 + 1) {
    piVar20[*piVar9] = (this->used).uid;
  }
  piVar9 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar19 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  pvVar2 = (this->adj).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar20 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar18 = 0;
  while( true ) {
    if (piVar9 == piVar19) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&newAdj,(long)(iVar18 + 1),(allocator_type *)local_98);
      _Var6._M_current =
           (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_98,_Var6,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (_Var6._M_current + iVar18),(allocator_type *)&vs);
      piVar20 = ((newAdj.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
      pp_Var7 = (_func_int **)
                ((newAdj.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
      piVar4 = ((newAdj.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      ((newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
      ((newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
      ((newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
      local_98._0_8_ = pp_Var7;
      local_98._8_8_ = piVar4;
      local_88 = piVar20;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_98);
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (((newAdj.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start,((newAdj.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish);
      std::vector<int,_std::allocator<int>_>::vector
                (&vs,(long)(iVar18 + 1),(allocator_type *)local_98);
      *vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           iVar1;
      fast_set::clear(this_00);
      piVar19 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar20 = (this_00->used).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (piVar9 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar9 != piVar19; piVar9 = piVar9 + 1) {
        piVar20[*piVar9] = (this->used).uid;
      }
      piVar19 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar20 = (this_00->used).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (piVar9 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar9 != piVar19; piVar9 = piVar9 + 1) {
        piVar20[*piVar9] = (this->used).uid;
      }
      uVar13 = 0;
      while (piVar20 = ((newAdj.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,
            uVar13 < (ulong)((long)((newAdj.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar20 >> 2)) {
        iVar18 = piVar20[uVar13];
        pvVar2 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar20 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar19 = *(pointer *)
                   ((long)&pvVar2[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar8 = false;
        iVar11 = 0;
        for (piVar9 = pvVar2[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar9 != piVar19; piVar9 = piVar9 + 1) {
          iVar12 = *piVar9;
          if ((piVar20[iVar12] < 0) && (piVar4[iVar12] != (this->used).uid)) {
            iVar10 = iVar11;
            if ((!bVar8) && (iVar1 < iVar12)) {
              iVar10 = iVar11 + 1;
              piVar5[iVar11] = iVar1;
              bVar8 = true;
            }
            iVar11 = iVar10 + 1;
            piVar5[iVar10] = iVar12;
          }
        }
        _Var6._M_current =
             (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        iVar12 = iVar11;
        if (!bVar8) {
          iVar12 = iVar11 + 1;
          _Var6._M_current[iVar11] = iVar1;
        }
        uVar13 = (ulong)((int)uVar13 + 1);
        vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar13] = iVar18;
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)local_98,_Var6,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (_Var6._M_current + iVar12),(allocator_type *)local_a8);
        piVar20 = newAdj.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage;
        pp_Var7 = (_func_int **)
                  newAdj.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar4 = newAdj.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_98._0_8_;
        newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_98._8_8_;
        newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_88;
        local_98._0_8_ = pp_Var7;
        local_98._8_8_ = piVar4;
        local_88 = piVar20;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_98);
      }
      fold::fold((fold *)local_98,
                 (int)((ulong)((long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&removed,&vs,&newAdj,
                 this);
      std::make_shared<fold,fold>((fold *)local_a8);
      iVar1 = this->modifiedN;
      this->modifiedN = iVar1 + 1;
      std::__shared_ptr<modified,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<modified,(__gnu_cxx::_Lock_policy)2> *)
                 ((this->modifieds).
                  super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar1),
                 (__shared_ptr<fold,_(__gnu_cxx::_Lock_policy)2> *)local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      modified::~modified((modified *)local_98);
      if (USE_DEPENDENCY_CHECKING == true) {
        this_01 = &this->dc_candidates;
        for (piVar20 = vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar9 = removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            piVar20 !=
            vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish; piVar20 = piVar20 + 1) {
          iVar1 = *piVar20;
          ArraySet::Insert(this_01,iVar1);
          pvVar2 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar19 = *(pointer *)
                     ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          for (piVar9 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; piVar9 != piVar19; piVar9 = piVar9 + 1) {
            ArraySet::Insert(this_01,*piVar9);
          }
        }
        for (; piVar9 != removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
          iVar1 = *piVar9;
          ArraySet::Insert(this_01,iVar1);
          pvVar2 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar17 = *(pointer *)
                     ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          for (piVar19 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar19 != piVar17; piVar19 = piVar19 + 1
              ) {
            ArraySet::Insert(this_01,*piVar19);
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vs.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&newAdj);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&removed.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    iVar11 = *piVar9;
    if (piVar20[iVar11] == (this->used).uid) break;
    piVar3 = *(pointer *)
              ((long)&pvVar2[iVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    piVar4 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar5 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar17 = pvVar2[iVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar17 != piVar3; piVar17 = piVar17 + 1) {
      iVar11 = *piVar17;
      if ((piVar4[iVar11] < 0) &&
         (iVar12 = (this->used).uid, iVar10 = piVar20[iVar11], piVar20[iVar11] = iVar12,
         iVar10 != iVar12)) {
        lVar14 = (long)iVar18;
        iVar18 = iVar18 + 1;
        piVar5[lVar14] = iVar11;
      }
    }
    piVar9 = piVar9 + 1;
  }
  __assert_fail("!used.get(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                ,0xdc,
                "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
               );
}

Assistant:

void branch_and_reduce_algorithm::compute_fold(std::vector<int> const &S, std::vector<int> const &NS) {
    assert(NS.size() == S.size() + 1);

    // remove all vertices but the 1. neighbour
    std::vector<int> removed(S.size() * 2);
    for (unsigned int i = 0; i < S.size(); i++)
        removed[i] = S[i];
    for (unsigned int i = 0; i < S.size(); i++)
        removed[S.size() + i] = NS[1 + i];

    // s = first neighbour
    int s = NS[0];
    used.clear();
    for (int v : S)
        used.add(v);
    std::vector<int> &tmp = modTmp;
    int p = 0;
    for (int v : NS)
    {
        assert(!used.get(v));
        for (int u : adj[v])
            if (x[u] < 0 && used.add(u))
            {
                tmp[p++] = u;
            }
    }
    // tmp contains N(N(S))\S

    // set edges of s
    std::vector<std::vector<int>> newAdj(p + 1);
    {
        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
        newAdj[0].swap(copyOfTmp);
    }
    std::sort(newAdj[0].begin(), newAdj[0].end());
    std::vector<int> vs(p + 1);
    vs[0] = s;
    used.clear();
    for (int v : S)
        used.add(v);
    for (int v : NS)
        used.add(v);

    // set edges of vertices in tmp
    for (unsigned int i = 0; i < newAdj[0].size(); i++)
    {
        int v = newAdj[0][i];
        p = 0;
        bool add = false;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                if (!add && s < u)
                {
                    tmp[p++] = s;
                    add = true;
                }
                tmp[p++] = u;
            }
        if (!add)
            tmp[p++] = s;
        vs[1 + i] = v;

        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i + 1].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<fold>(fold(S.size(), removed, vs, newAdj, this));

    // dependency checking
    if (USE_DEPENDENCY_CHECKING) {
        for (int v : vs) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }

        for (int v : removed) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }
    }
}